

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O0

EStatusCode __thiscall
AbstractContentContext::Tc(AbstractContentContext *this,double inCharacterSpace)

{
  EStatusCode EVar1;
  allocator<char> local_39;
  string local_38;
  double local_18;
  double inCharacterSpace_local;
  AbstractContentContext *this_local;
  
  local_18 = inCharacterSpace;
  inCharacterSpace_local = (double)this;
  RenewStreamConnectAndStoreResult(this);
  AssertProcsetAvailable(this,&KProcsetPDF_abi_cxx11_);
  AssertProcsetAvailable(this,&KProcsetText_abi_cxx11_);
  PrimitiveObjectsWriter::WriteDouble(&this->mPrimitiveWriter,local_18,eTokenSeparatorSpace);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Tc",&local_39);
  PrimitiveObjectsWriter::WriteKeyword(&this->mPrimitiveWriter,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  EVar1 = GetCurrentStatusCode(this);
  return EVar1;
}

Assistant:

EStatusCode AbstractContentContext::Tc(double inCharacterSpace)
{
	RenewStreamConnectAndStoreResult();
	AssertProcsetAvailable(KProcsetPDF);
	AssertProcsetAvailable(KProcsetText);

	mPrimitiveWriter.WriteDouble(inCharacterSpace);
	mPrimitiveWriter.WriteKeyword("Tc");
	return GetCurrentStatusCode();
}